

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NortekDVL.h
# Opt level: O0

int ConnectNortekDVL(NORTEKDVL *pNortekDVL,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  char local_128 [8];
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  NORTEKDVL *pNortekDVL_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  memset(pNortekDVL->szCfgFilePath,0,0x100);
  sprintf(pNortekDVL->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(local_128,0,0x100);
    memset(pNortekDVL->szDevPath,0,0x100);
    sprintf(pNortekDVL->szDevPath,"COM1");
    pNortekDVL->BaudRate = 0x2580;
    pNortekDVL->timeout = 0x5dc;
    pNortekDVL->threadperiod = 100;
    pNortekDVL->bSaveRawData = 1;
    pNortekDVL->bEnable_PD6_SA = 0;
    pNortekDVL->bEnable_PD6_TS = 0;
    pNortekDVL->bEnable_PD6_BI = 0;
    pNortekDVL->bEnable_PD6_BS = 1;
    pNortekDVL->bEnable_PD6_BE = 0;
    pNortekDVL->bEnable_PD6_BD = 0;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",pNortekDVL->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->bEnable_PD6_SA);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->bEnable_PD6_TS);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->bEnable_PD6_BI);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->bEnable_PD6_BS);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->bEnable_PD6_BE);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pNortekDVL->bEnable_PD6_BD);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pNortekDVL->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pNortekDVL->threadperiod = 100;
  }
  pNortekDVL->LastAltitude = 0.0;
  iVar1 = OpenRS232Port(&pNortekDVL->RS232Port,pNortekDVL->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pNortekDVL->RS232Port,pNortekDVL->BaudRate,'\0',0,'\b','\0',
                                pNortekDVL->timeout);
    if (iVar1 == 0) {
      printf("NortekDVL connected.\n");
      pNortekDVL_local._4_4_ = 0;
    }
    else {
      printf("Unable to connect to a NortekDVL.\n");
      CloseRS232Port(&pNortekDVL->RS232Port);
      pNortekDVL_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a NortekDVL.\n");
    pNortekDVL_local._4_4_ = 1;
  }
  return pNortekDVL_local._4_4_;
}

Assistant:

inline int ConnectNortekDVL(NORTEKDVL* pNortekDVL, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pNortekDVL->szCfgFilePath, 0, sizeof(pNortekDVL->szCfgFilePath));
	sprintf(pNortekDVL->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pNortekDVL->szDevPath, 0, sizeof(pNortekDVL->szDevPath));
		sprintf(pNortekDVL->szDevPath, "COM1");
		pNortekDVL->BaudRate = 9600;
		pNortekDVL->timeout = 1500;
		pNortekDVL->threadperiod = 100;
		pNortekDVL->bSaveRawData = 1;
		pNortekDVL->bEnable_PD6_SA = 0;
		pNortekDVL->bEnable_PD6_TS = 0;
		pNortekDVL->bEnable_PD6_BI = 0;
		pNortekDVL->bEnable_PD6_BS = 1;
		pNortekDVL->bEnable_PD6_BE = 0;
		pNortekDVL->bEnable_PD6_BD = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pNortekDVL->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_SA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_TS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_BI) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_BS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_BE) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_BD) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pNortekDVL->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pNortekDVL->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pNortekDVL->pfSaveFile = NULL;

	pNortekDVL->LastAltitude = 0;

	if (OpenRS232Port(&pNortekDVL->RS232Port, pNortekDVL->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NortekDVL.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pNortekDVL->RS232Port, pNortekDVL->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pNortekDVL->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NortekDVL.\n");
		CloseRS232Port(&pNortekDVL->RS232Port);
		return EXIT_FAILURE;
	}

	printf("NortekDVL connected.\n");

	return EXIT_SUCCESS;
}